

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataSocket.cpp
# Opt level: O2

void __thiscall
brynet::net::DataSocket::sendInLoop
          (DataSocket *this,PACKET_PTR *packet,PACKED_SENDED_CALLBACK *callback)

{
  size_type sVar1;
  bool bVar2;
  pending_packet local_60;
  
  bVar2 = EventLoop::isInLoopThread
                    ((this->mEventLoop).
                     super___shared_ptr<brynet::net::EventLoop,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  if (bVar2) {
    bVar2 = EventLoop::isInLoopThread
                      ((this->mEventLoop).
                       super___shared_ptr<brynet::net::EventLoop,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                      );
    if (bVar2) {
      sVar1 = ((packet->
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               )._M_ptr)->_M_string_length;
      std::
      __shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ::__shared_ptr((__shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                      *)&local_60,
                     &packet->
                      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                    );
      local_60.left = sVar1;
      std::function<void_()>::function(&local_60.mCompleteCallback,callback);
      std::
      deque<brynet::net::DataSocket::pending_packet,_std::allocator<brynet::net::DataSocket::pending_packet>_>
      ::emplace_back<brynet::net::DataSocket::pending_packet>(&this->mSendList,&local_60);
      pending_packet::~pending_packet(&local_60);
      runAfterFlush(this);
    }
    return;
  }
  __assert_fail("mEventLoop->isInLoopThread()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dyu[P]brynet/src/brynet/net/DataSocket.cpp"
                ,0x89,
                "void brynet::net::DataSocket::sendInLoop(const PACKET_PTR &, const PACKED_SENDED_CALLBACK &)"
               );
}

Assistant:

void DataSocket::sendInLoop(const PACKET_PTR& packet, const PACKED_SENDED_CALLBACK& callback)
{
    assert(mEventLoop->isInLoopThread());
    if (mEventLoop->isInLoopThread())
    {
        auto len = packet->size();
        mSendList.push_back({ packet, len, callback });
        runAfterFlush();
    }
}